

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

string * mp::internal::
         OptionHelper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::Parse(string *__return_storage_ptr__,char **s,bool splitString)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  undefined7 in_register_00000011;
  char *pcVar4;
  char *pcVar5;
  
  pcVar5 = *s;
  pcVar4 = pcVar5;
  if ((int)CONCAT71(in_register_00000011,splitString) == 0) {
    cVar1 = *pcVar5;
    if (cVar1 != '\0') {
      if ((cVar1 == '\"') || (cVar1 == '\'')) {
        pcVar2 = pcVar5 + 1;
        do {
          pcVar4 = pcVar2;
          pcVar2 = pcVar4 + 1;
        } while (*pcVar4 != cVar1);
        *s = pcVar4 + 1;
        pcVar5 = pcVar5 + 1;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        goto LAB_00343724;
      }
      do {
        iVar3 = isspace((int)cVar1);
        if (iVar3 != 0) break;
        cVar1 = pcVar4[1];
        pcVar4 = pcVar4 + 1;
      } while (cVar1 != '\0');
    }
    *s = pcVar4;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    for (; (*pcVar4 != '\0' && (*pcVar4 != '\n')); pcVar4 = pcVar4 + 1) {
    }
    *s = pcVar4;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
LAB_00343724:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string OptionHelper<std::string>::Parse(const char *&s, bool splitString) {
  const char *start = s;
  if (splitString) // if the string has been already split (by the command line parser)
  {                // @todo consider quotes here too?
    s = SkipToEnd(s);
    return std::string(start, s - start);
  }
  if (quoted(s))
  {
    s = SkipToMatchingQuote(s);
    return std::string(start + 1, s - start - 2);
  }
  {
    s = SkipNonSpaces(s);
    return std::string(start, s - start);
  }
}